

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArtificialPopulation.cpp
# Opt level: O0

void __thiscall ArtificialPopulation::update(ArtificialPopulation *this)

{
  value_type value;
  reference ppEVar1;
  long in_RDI;
  double dVar2;
  double dVar3;
  MatrixXd *unaff_retaddr;
  ANN *in_stack_00000008;
  int i;
  Matrix<double,__1,__1,_0,__1,__1> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Population *in_stack_ffffffffffffff90;
  Logging *this_00;
  int local_48;
  
  while( true ) {
    dVar3 = *(double *)(in_RDI + 0x48);
    dVar2 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x50));
    if (dVar2 <= dVar3) break;
    Population::resetOutput(in_stack_ffffffffffffff90);
    dVar3 = *(double *)(in_RDI + 0x60);
    this_00 = (Logging *)&stack0xffffffffffffffc8;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    ANN::predict(in_stack_00000008,unaff_retaddr);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x170cd6)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x170ce0)
    ;
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x28); local_48 = local_48 + 1) {
      value = (value_type)operator_new(0x20);
      in_stack_ffffffffffffff90 =
           (Population *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,
                      (Index)dVar3,(Index)in_stack_ffffffffffffff90);
      ValueEvent::ValueEvent((ValueEvent *)this_00,dVar3);
      ppEVar1 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 8),(long)local_48)
      ;
      *ppEVar1 = value;
      in_stack_ffffffffffffff78 = *(Matrix<double,__1,__1,_0,__1,__1> **)(in_RDI + 0x58);
      in_stack_ffffffffffffff84 = local_48;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,
                 (Index)dVar3,(Index)in_stack_ffffffffffffff90);
      Logging::logValue(this_00,(long)dVar3,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (int)in_stack_ffffffffffffff90,(double)value);
    }
    dVar3 = Clock::getDt(*(Clock **)(in_RDI + 0x50));
    *(double *)(in_RDI + 0x48) = dVar3 + *(double *)(in_RDI + 0x48);
  }
  return;
}

Assistant:

void ArtificialPopulation::update() {
    while(current_time < clock->getCurrentTime()) {
        resetOutput();
        annOutput = ann->predict(annInput);
        for(int i = 0; i < numberOfOutputNeurons; i++) {
            output[i] = new ValueEvent(annOutput(0, i));
            logger->logValue((long)this, i, EventType::Value, annOutput(0, i));
        }
        current_time += clock->getDt();
    }
}